

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

int anon_unknown.dwarf_7f0079::MapSpvVersionToIndex(SpvVersion *spvVersion)

{
  if (0 < spvVersion->openGl) {
    return 1;
  }
  if (0 < spvVersion->vulkan) {
    return spvVersion->vulkanRelaxed | 2;
  }
  return 0;
}

Assistant:

int MapSpvVersionToIndex(const SpvVersion& spvVersion)
{
    int index = 0;

    if (spvVersion.openGl > 0)
        index = 1;
    else if (spvVersion.vulkan > 0) {
        if (!spvVersion.vulkanRelaxed)
            index = 2;
        else
            index = 3;
    }

    assert(index < SpvVersionCount);

    return index;
}